

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_udev.cc
# Opt level: O2

int __thiscall
ccel::udev::virtual_keyboard_handler::open
          (virtual_keyboard_handler *this,char *__file,int __oflag,...)

{
  int iVar1;
  ssize_t sVar2;
  int i;
  int iVar3;
  uint uVar4;
  
  iVar1 = (*(this->super_base_handler)._vptr_base_handler[4])(this,__file,___oflag);
  iVar3 = 0;
  if ((char)iVar1 == '\0') {
    ioctl(this->_fd,0x40045565,0x39);
    for (uVar4 = 0; uVar4 != 0xf8; uVar4 = uVar4 + 1) {
      ioctl(this->_fd,0x40045565,(ulong)uVar4);
    }
    iVar3 = 0;
    ioctl(this->_fd,0x40045564,1);
    ioctl(this->_fd,0x40045564,2);
    memset(&this->_udev,0,0x45c);
    sVar2 = write(this->_fd,&this->_udev,0x45c);
    if (sVar2 < 0) {
      iVar3 = -1;
    }
    else {
      ioctl(this->_fd,0x5501);
      this->_open = true;
    }
  }
  return iVar3;
}

Assistant:

int virtual_keyboard_handler::open() {
  if (!this->opened()) { // If is not opened
    ioctl(_fd, UI_SET_KEYBIT, KEY_SPACE);
    for (auto i = 0; i < 248; i++) { // Bind and allow keycodes from 0 to 248
      ioctl(_fd, UI_SET_KEYBIT, i);
    }
    ioctl(_fd, UI_SET_EVBIT, EV_KEY);
    ioctl(_fd, UI_SET_EVBIT, EV_REL);
    _udev = uinput_user_dev{};
    if (write(_fd, &_udev, sizeof(_udev)) < 0)
      return -1;
    ioctl(_fd, UI_DEV_CREATE);
    _open = true;
  }
  return 0;
}